

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cpp
# Opt level: O2

bool __thiscall MeCab::Connector::openText(Connector *this,char *filename)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  char *str;
  size_t sVar4;
  die local_251;
  scoped_fixed_array<char,_8192> buf;
  char *column [2];
  ifstream ifs;
  uint auStack_208 [122];
  
  std::ifstream::ifstream(&ifs,filename,_S_in);
  uVar1 = *(uint *)((long)auStack_208 + *(long *)(_ifs + -0x18));
  if ((uVar1 & 5) == 0) {
    buf._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0019ed28;
    str = (char *)operator_new__(0x2000);
    buf.size_ = 0x2000;
    buf.ptr_ = str;
    std::istream::getline((char *)&ifs,(long)str);
    sVar4 = tokenize2<char**>(str,"\t ",column,2);
    if (sVar4 != 2) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                              );
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x39);
      poVar3 = std::operator<<(poVar3,") [");
      poVar3 = std::operator<<(poVar3,"tokenize2(buf.get(), \"\\t \", column, 2) == 2");
      poVar3 = std::operator<<(poVar3,"] ");
      poVar3 = std::operator<<(poVar3,"format error: ");
      std::operator<<(poVar3,buf.ptr_);
      die::~die(&local_251);
    }
    iVar2 = atoi(column[0]);
    this->lsize_ = (unsigned_short)iVar2;
    iVar2 = atoi(column[1]);
    this->rsize_ = (unsigned_short)iVar2;
    scoped_fixed_array<char,_8192>::~scoped_fixed_array(&buf);
  }
  else {
    poVar3 = std::operator<<((ostream *)&this->what_,"no such file or directory: ");
    std::operator<<(poVar3,filename);
  }
  std::ifstream::~ifstream(&ifs);
  return (uVar1 & 5) == 0;
}

Assistant:

bool Connector::openText(const char *filename) {
  std::ifstream ifs(WPATH(filename));
  if (!ifs) {
    WHAT << "no such file or directory: " << filename;
    return false;
  }
  char *column[2];
  scoped_fixed_array<char, BUF_SIZE> buf;
  ifs.getline(buf.get(), buf.size());
  CHECK_DIE(tokenize2(buf.get(), "\t ", column, 2) == 2)
      << "format error: " << buf.get();
  lsize_ = std::atoi(column[0]);
  rsize_ = std::atoi(column[1]);
  return true;
}